

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O2

int run_test_condvar_2(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_thread_t thread;
  worker_config_conflict wc;
  
  worker_config_init(&wc,1,condvar_signal,condvar_wait);
  iVar1 = uv_thread_create(&thread,worker,&wc);
  if (iVar1 == 0) {
    iVar1 = (*wc.wait_cond)(&wc,&wc.posted_1);
    if (iVar1 == 0) {
      (*wc.signal_cond)(&wc,&wc.posted_2);
      iVar1 = uv_thread_join(&thread);
      if (iVar1 == 0) {
        worker_config_destroy(&wc);
        return 0;
      }
      pcVar3 = "0 == uv_thread_join(&thread)";
      uVar2 = 0x9e;
    }
    else {
      pcVar3 = "0 == wc.wait_cond(&wc, &wc.posted_1)";
      uVar2 = 0x9b;
    }
  }
  else {
    pcVar3 = "0 == uv_thread_create(&thread, worker, &wc)";
    uVar2 = 0x98;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-condvar.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(condvar_2) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_wait);
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  ASSERT(0 == wc.wait_cond(&wc, &wc.posted_1));
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT(0 == uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}